

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_4,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_4> *pVVar1;
  float *pfVar2;
  int col;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  float v;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  Vector<float,_3> res;
  Type in0;
  Type in1;
  int aiStack_18 [6];
  long lVar11;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    uVar8 = *(undefined8 *)(evalCtx->coords).m_data;
    uVar9 = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    uVar8 = 0x3e4ccccd3fb33333;
    uVar9 = 0x3f333333bf000000;
  }
  in0.m_data[0] = (float)(int)uVar8;
  in0.m_data[1] = (float)SUB84(uVar8,4);
  in0.m_data[2] = (float)(int)uVar9;
  in0.m_data[3] = (float)SUB84(uVar9,4);
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pVVar1 = in1.m_data.m_data + 1;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      auVar10 = _DAT_00a99400;
      do {
        bVar12 = SUB164(auVar10 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar10 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar3 != lVar6) {
            uVar13 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar1 + -1))->m_data[0].m_data + lVar6) =
               uVar13;
        }
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar3 + -0x10 != lVar6) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)pVVar1->m_data + lVar6) = uVar13;
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
      pVVar1 = (Vector<float,_4> *)(pVVar1->m_data + 1);
    } while (lVar5 != 4);
    in1.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in1.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    in1.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    in1.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar2 = (float *)&in1;
    in1.m_data.m_data[2].m_data[0] = 0.0;
    in1.m_data.m_data[2].m_data[1] = 0.0;
    in1.m_data.m_data[2].m_data[2] = 0.0;
    in1.m_data.m_data[2].m_data[3] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[2] = 0.0;
    in1.m_data.m_data[1].m_data[3] = 0.0;
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[2] = 0.0;
    in1.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &DAT_00af0af0;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = (float)*(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  res.m_data[2] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  pVVar1 = (Vector<float,_4> *)&in1;
  lVar3 = 0;
  do {
    fVar7 = 0.0;
    lVar5 = 0;
    do {
      fVar7 = fVar7 + ((Vector<tcu::Vector<float,_4>,_3> *)pVVar1->m_data)->m_data[0].m_data[lVar5]
                      * in0.m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    res.m_data[lVar3] = fVar7;
    lVar3 = lVar3 + 1;
    pVVar1 = pVVar1 + 1;
  } while (lVar3 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}